

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int svd_gr(double *A,int M,int N,double *U,double *V,double *q)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  double *pdVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  double *pdVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  double *pdVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double *local_118;
  double *local_80;
  double *local_38;
  
  uVar14 = (ulong)(uint)N;
  lVar29 = (long)N;
  __size = lVar29 * 8;
  __ptr = malloc(__size);
  uVar30 = 0;
  dVar33 = macheps();
  uVar27 = (ulong)(uint)(N * M);
  if (N * M < 1) {
    uVar27 = uVar30;
  }
  for (; uVar27 != uVar30; uVar30 = uVar30 + 1) {
    U[uVar30] = A[uVar30];
  }
  lVar21 = (long)M;
  uVar27 = (ulong)(int)(N - 1U);
  uVar30 = 0;
  if (0 < N) {
    uVar30 = (ulong)(uint)N;
  }
  uVar23 = (ulong)(uint)M;
  lVar9 = lVar29 * 8 + 8;
  iVar2 = 1;
  dVar40 = 0.0;
  dVar39 = 0.0;
  dVar38 = 0.0;
  uVar25 = 0;
  pdVar10 = U;
  local_38 = U;
  while( true ) {
    uVar16 = uVar25 & 0xffffffff;
    if ((int)uVar25 < M) {
      uVar16 = (ulong)(uint)M;
    }
    if (uVar25 == uVar30) break;
    lVar4 = (long)iVar2;
    dVar41 = dVar40 * dVar38;
    *(double *)((long)__ptr + uVar25 * 8) = dVar41;
    dVar34 = 0.0;
    dVar38 = 0.0;
    if ((long)uVar25 < lVar21) {
      pdVar31 = local_38 + lVar4;
      pdVar6 = pdVar10;
      uVar14 = uVar23;
      while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
        dVar38 = dVar38 + ABS(*pdVar6);
        pdVar6 = pdVar6 + lVar29;
      }
      dVar34 = 0.0;
      if ((dVar38 != 0.0) || (NAN(dVar38))) {
        dVar40 = 0.0;
        pdVar6 = pdVar10;
        uVar14 = uVar23;
        while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
          dVar34 = *pdVar6 / dVar38;
          *pdVar6 = dVar34;
          dVar40 = dVar40 + dVar34 * dVar34;
          pdVar6 = pdVar6 + lVar29;
        }
        iVar1 = (N + 1) * (int)uVar25;
        dVar36 = U[iVar1];
        if (dVar40 < 0.0) {
          dVar34 = sqrt(dVar40);
        }
        else {
          dVar34 = SQRT(dVar40);
        }
        dVar34 = (double)(~-(ulong)(dVar36 < 0.0) & (ulong)-dVar34 |
                         -(ulong)(dVar36 < 0.0) & (ulong)dVar34);
        U[iVar1] = dVar36 - dVar34;
        pdVar6 = pdVar10;
        if ((long)uVar25 < (long)uVar27) {
          for (lVar5 = lVar4; lVar5 < lVar29; lVar5 = lVar5 + 1) {
            dVar35 = 0.0;
            lVar15 = 0;
            for (uVar14 = uVar16; uVar25 != uVar14; uVar14 = uVar14 - 1) {
              dVar35 = dVar35 + *(double *)((long)pdVar10 + lVar15) *
                                *(double *)((long)pdVar31 + lVar15);
              lVar15 = lVar15 + __size;
            }
            lVar15 = 0;
            for (uVar14 = uVar16; uVar25 != uVar14; uVar14 = uVar14 - 1) {
              *(double *)((long)pdVar31 + lVar15) =
                   *(double *)((long)pdVar10 + lVar15) * (dVar35 / (dVar36 * dVar34 - dVar40)) +
                   *(double *)((long)pdVar31 + lVar15);
              lVar15 = lVar15 + __size;
            }
            pdVar31 = pdVar31 + 1;
          }
        }
        for (; uVar25 != uVar16; uVar16 = uVar16 - 1) {
          *pdVar6 = *pdVar6 * dVar38;
          pdVar6 = pdVar6 + lVar29;
        }
      }
    }
    dVar40 = 0.0;
    dVar34 = dVar34 * dVar38;
    uVar14 = uVar25 + 1;
    q[uVar25] = dVar34;
    if (uVar25 == N - 1U || lVar21 <= (long)uVar25) {
      dVar38 = 0.0;
    }
    else {
      pdVar31 = (double *)(lVar9 * lVar4 + (long)U);
      dVar38 = 0.0;
      for (lVar5 = lVar4; lVar5 < lVar21; lVar5 = lVar5 + 1) {
        dVar38 = dVar38 + ABS(local_38[lVar5]);
      }
      dVar40 = 0.0;
      if ((dVar38 != 0.0) || (NAN(dVar38))) {
        dVar34 = 0.0;
        for (lVar5 = lVar4; lVar5 < lVar29; lVar5 = lVar5 + 1) {
          dVar40 = local_38[lVar5] / dVar38;
          local_38[lVar5] = dVar40;
          dVar34 = dVar34 + dVar40 * dVar40;
        }
        dVar41 = U[uVar25 * lVar29 + uVar14];
        if (dVar34 < 0.0) {
          dVar40 = sqrt(dVar34);
        }
        else {
          dVar40 = SQRT(dVar34);
        }
        dVar40 = (double)(~-(ulong)(dVar41 < 0.0) & (ulong)-dVar40 |
                         -(ulong)(dVar41 < 0.0) & (ulong)dVar40);
        U[uVar25 * lVar29 + uVar14] = dVar41 - dVar40;
        for (lVar5 = lVar4; lVar15 = lVar4, lVar5 < lVar29; lVar5 = lVar5 + 1) {
          *(double *)((long)__ptr + lVar5 * 8) = local_38[lVar5] / (dVar41 * dVar40 - dVar34);
        }
        for (; lVar15 < lVar21; lVar15 = lVar15 + 1) {
          dVar34 = 0.0;
          pdVar6 = pdVar31;
          for (lVar5 = lVar4; lVar5 < lVar29; lVar5 = lVar5 + 1) {
            dVar34 = dVar34 + *pdVar6 * local_38[lVar5];
            pdVar6 = pdVar6 + 1;
          }
          for (lVar5 = 0; lVar4 + lVar5 < lVar29; lVar5 = lVar5 + 1) {
            pdVar31[lVar5] =
                 *(double *)((long)__ptr + lVar5 * 8 + lVar4 * 8) * dVar34 + pdVar31[lVar5];
          }
          pdVar31 = pdVar31 + lVar29;
        }
        for (; lVar4 < lVar29; lVar4 = lVar4 + 1) {
          local_38[lVar4] = local_38[lVar4] * dVar38;
        }
        dVar34 = q[uVar25];
        dVar41 = *(double *)((long)__ptr + uVar25 * 8);
      }
    }
    dVar36 = ABS(dVar41) + ABS(dVar34);
    if (ABS(dVar41) + ABS(dVar34) <= dVar39) {
      dVar36 = dVar39;
    }
    dVar39 = dVar36;
    iVar2 = iVar2 + 1;
    uVar23 = uVar23 - 1;
    pdVar10 = pdVar10 + lVar29 + 1;
    local_38 = local_38 + lVar29;
    uVar25 = uVar14;
  }
  lVar4 = lVar29 * uVar27;
  pdVar10 = U + lVar4;
  pdVar31 = V + uVar27;
  pdVar6 = V + lVar4;
  for (uVar25 = uVar27; -1 < (long)uVar25; uVar25 = uVar25 - 1) {
    uVar23 = uVar25 & 0xffffffff;
    if ((long)uVar25 < (long)uVar27) {
      if ((dVar40 != 0.0) || (NAN(dVar40))) {
        dVar38 = U[uVar25 + (long)((int)uVar25 * N) + 1];
        lVar15 = (long)(int)uVar14;
        pdVar19 = (double *)((long)pdVar31 + __size * lVar15);
        for (lVar5 = lVar15; lVar5 < lVar29; lVar5 = lVar5 + 1) {
          *pdVar19 = pdVar10[lVar5] / (dVar40 * dVar38);
          pdVar19 = pdVar19 + lVar29;
        }
        pdVar19 = (double *)(lVar9 * lVar15 + (long)V);
        for (lVar5 = lVar15; lVar5 < lVar29; lVar5 = lVar5 + 1) {
          dVar40 = 0.0;
          pdVar7 = pdVar19;
          for (lVar28 = lVar15; lVar28 < lVar29; lVar28 = lVar28 + 1) {
            dVar40 = dVar40 + pdVar10[lVar28] * *pdVar7;
            pdVar7 = pdVar7 + lVar29;
          }
          lVar8 = 0;
          for (lVar28 = lVar15; lVar28 < lVar29; lVar28 = lVar28 + 1) {
            *(double *)((long)pdVar19 + lVar8) =
                 *(double *)((long)pdVar31 + lVar8 + __size * lVar15) * dVar40 +
                 *(double *)((long)pdVar19 + lVar8);
            lVar8 = lVar8 + __size;
          }
          pdVar19 = pdVar19 + 1;
        }
      }
      lVar5 = (long)(int)uVar14;
      pdVar19 = (double *)(__size * lVar5 + (long)pdVar31);
      for (; lVar5 < lVar29; lVar5 = lVar5 + 1) {
        *pdVar19 = 0.0;
        pdVar6[lVar5] = 0.0;
        pdVar19 = pdVar19 + lVar29;
      }
    }
    V[uVar25 * lVar29 + uVar25] = 1.0;
    dVar40 = *(double *)((long)__ptr + uVar25 * 8);
    pdVar10 = pdVar10 + -lVar29;
    pdVar31 = pdVar31 + -1;
    pdVar6 = pdVar6 + -lVar29;
    uVar14 = uVar23;
  }
  pdVar10 = U + lVar4;
  pdVar31 = (double *)(lVar9 * uVar27 + (long)U);
  uVar18 = (N + 1) * N;
  uVar11 = ~N;
  uVar12 = uVar18 - 1;
  uVar26 = N * N;
  uVar3 = uVar26 - 1;
  iVar2 = N;
  for (uVar14 = uVar27; -1 < (long)uVar14; uVar14 = uVar14 - 1) {
    dVar40 = q[uVar14];
    if ((long)uVar14 < (long)uVar27) {
      for (lVar9 = (long)iVar2; lVar9 < lVar29; lVar9 = lVar9 + 1) {
        pdVar10[lVar9] = 0.0;
      }
    }
    if ((dVar40 != 0.0) || (pdVar6 = pdVar31, uVar25 = uVar14, NAN(dVar40))) {
      pdVar6 = pdVar31;
      uVar25 = uVar14;
      if (uVar14 != uVar27) {
        uVar23 = uVar14 & 0xffffffff;
        uVar13 = uVar18;
        uVar20 = uVar26;
        while (uVar24 = (int)uVar23 + 1, uVar23 = (ulong)uVar24, (int)uVar24 < N) {
          dVar38 = 0.0;
          uVar22 = uVar12;
          uVar24 = uVar13;
          for (iVar1 = iVar2; iVar1 < M; iVar1 = iVar1 + 1) {
            dVar38 = dVar38 + U[uVar22] * U[uVar24];
            uVar24 = uVar24 + N;
            uVar22 = uVar22 + N;
          }
          dVar34 = U[uVar14 + (long)((int)uVar14 * N)];
          uVar16 = uVar14 & 0xffffffff;
          uVar22 = uVar3;
          uVar24 = uVar20;
          while( true ) {
            if (M <= (int)uVar16) break;
            U[uVar24] = U[uVar22] * ((dVar38 / dVar34) / dVar40) + U[uVar24];
            uVar24 = uVar24 + N;
            uVar22 = uVar22 + N;
            uVar16 = (ulong)((int)uVar16 + 1);
          }
          uVar13 = uVar13 + 1;
          uVar20 = uVar20 + 1;
        }
      }
      for (; (long)uVar25 < lVar21; uVar25 = uVar25 + 1) {
        *pdVar6 = *pdVar6 / dVar40;
        pdVar6 = pdVar6 + lVar29;
      }
    }
    else {
      for (; (long)uVar25 < lVar21; uVar25 = uVar25 + 1) {
        *pdVar6 = 0.0;
        pdVar6 = pdVar6 + lVar29;
      }
    }
    U[uVar14 * lVar29 + uVar14] = U[uVar14 * lVar29 + uVar14] + 1.0;
    iVar2 = iVar2 + -1;
    pdVar10 = pdVar10 + -lVar29;
    pdVar31 = (double *)((long)pdVar31 + (__size ^ 0xfffffffffffffff8));
    uVar18 = uVar18 + uVar11;
    uVar12 = uVar12 + uVar11;
    uVar26 = uVar26 + uVar11;
    uVar3 = uVar3 + uVar11;
  }
  dVar33 = dVar33 * dVar39;
  uVar14 = 0;
  if (0 < M) {
    uVar14 = (ulong)(uint)M;
  }
  local_118 = V + uVar27;
LAB_0013a8b9:
  if ((long)uVar27 < 0) {
    svd_sort(U,M,N,V,q);
    free(__ptr);
    return 0;
  }
  uVar25 = uVar27 - 1;
  iVar2 = 0;
  do {
    if (iVar2 == 0x32) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    iVar2 = iVar2 + 1;
    uVar16 = (long)(int)uVar27;
    for (uVar23 = uVar27; uVar12 = (uint)uVar23, -1 < (int)uVar12; uVar23 = uVar23 - 1) {
      if (ABS(*(double *)((long)__ptr + (uVar23 & 0xffffffff) * 8)) <= dVar33) goto LAB_0013aa45;
      if (ABS(q[(uVar23 & 0xffffffff) - 1]) <= dVar33) goto LAB_0013a933;
      uVar16 = uVar16 - 1;
    }
    uVar12 = 0xffffffff;
LAB_0013a933:
    if ((long)uVar23 < 0) {
      uVar23 = 0xffffffffffffffff;
    }
    lVar21 = uVar23 * 8;
    if ((long)uVar16 < 0) {
      uVar16 = 0xffffffffffffffff;
    }
    dVar40 = 0.0;
    dVar39 = 1.0;
    for (; (long)uVar23 <= (long)uVar27; uVar23 = uVar23 + 1) {
      dVar38 = *(double *)((long)__ptr + uVar23 * 8);
      dVar39 = dVar39 * dVar38;
      *(double *)((long)__ptr + uVar23 * 8) = dVar40 * dVar38;
      if (ABS(dVar39) <= dVar33) break;
      dVar40 = q[uVar23];
      dVar38 = hypot(dVar39,dVar40);
      q[uVar23] = dVar38;
      dVar40 = dVar40 / dVar38;
      dVar39 = -dVar39 / dVar38;
      pdVar10 = U;
      uVar17 = uVar14;
      while (bVar32 = uVar17 != 0, uVar17 = uVar17 - 1, bVar32) {
        dVar38 = pdVar10[uVar16 - 1];
        dVar34 = *(double *)((long)pdVar10 + lVar21);
        pdVar10[uVar16 - 1] = dVar38 * dVar40 + dVar39 * dVar34;
        *(double *)((long)pdVar10 + lVar21) = dVar34 * dVar40 - dVar39 * dVar38;
        pdVar10 = pdVar10 + lVar29;
      }
      lVar21 = lVar21 + 8;
    }
    uVar23 = (ulong)uVar12;
LAB_0013aa45:
    dVar40 = q[uVar27];
    if ((int)uVar23 == (int)uVar27) break;
    lVar9 = (long)(int)uVar23;
    dVar39 = q[lVar9];
    dVar38 = q[uVar25];
    dVar34 = *(double *)((long)__ptr + uVar25 * 8);
    dVar41 = *(double *)((long)__ptr + uVar27 * 8);
    dVar34 = ((dVar38 / dVar41 + ((dVar34 - dVar40) / dVar38) * ((dVar40 + dVar34) / dVar41)) -
             dVar41 / dVar38) * 0.5;
    dVar36 = hypot(dVar34,1.0);
    dVar34 = (dVar41 / dVar39) *
             (dVar38 / ((double)((ulong)-dVar36 & -(ulong)(dVar34 < 0.0) |
                                ~-(ulong)(dVar34 < 0.0) & (ulong)dVar36) + dVar34) - dVar41) +
             (dVar39 - (dVar40 / dVar39) * dVar40);
    local_80 = V + lVar9 + 1;
    lVar4 = lVar9 << 0x20;
    pdVar10 = U + lVar9 + 1;
    dVar38 = 1.0;
    dVar40 = 1.0;
    lVar21 = lVar9;
    while (lVar21 < (long)uVar27) {
      lVar5 = lVar21 + 1;
      dVar41 = *(double *)((long)__ptr + lVar5 * 8);
      dVar36 = q[lVar5];
      dVar40 = dVar40 * dVar41;
      dVar41 = dVar38 * dVar41;
      dVar35 = hypot(dVar34,dVar40);
      *(double *)((long)__ptr + lVar21 * 8) = dVar35;
      dVar34 = dVar34 / dVar35;
      dVar35 = dVar40 / dVar35;
      dVar40 = dVar36 * dVar35;
      lVar15 = lVar4;
      pdVar31 = local_80;
      uVar23 = uVar30;
      while (bVar32 = uVar23 != 0, uVar23 = uVar23 - 1, bVar32) {
        dVar38 = *(double *)((long)V + (lVar15 >> 0x1d));
        dVar37 = *pdVar31;
        *(double *)((long)V + (lVar15 >> 0x1d)) = dVar38 * dVar34 + dVar35 * dVar37;
        *pdVar31 = dVar37 * dVar34 - dVar35 * dVar38;
        pdVar31 = pdVar31 + lVar29;
        lVar15 = lVar15 + (lVar29 << 0x20);
      }
      dVar38 = dVar39 * dVar34 + dVar41 * dVar35;
      dVar37 = hypot(dVar38,dVar40);
      q[lVar21] = dVar37;
      dVar40 = dVar40 / dVar37;
      if ((dVar37 == 0.0) && (!NAN(dVar37))) {
        dVar40 = dVar35;
      }
      dVar38 = dVar38 / dVar37;
      if ((dVar37 == 0.0) && (!NAN(dVar37))) {
        dVar38 = dVar34;
      }
      dVar39 = dVar41 * dVar34 + -dVar39 * dVar35;
      dVar36 = dVar36 * dVar34;
      lVar21 = lVar4;
      pdVar31 = pdVar10;
      uVar23 = uVar14;
      while (bVar32 = uVar23 != 0, uVar23 = uVar23 - 1, bVar32) {
        dVar34 = *(double *)((long)U + (lVar21 >> 0x1d));
        dVar41 = *pdVar31;
        *(double *)((long)U + (lVar21 >> 0x1d)) = dVar34 * dVar38 + dVar40 * dVar41;
        *pdVar31 = dVar41 * dVar38 - dVar40 * dVar34;
        pdVar31 = pdVar31 + lVar29;
        lVar21 = lVar21 + (lVar29 << 0x20);
      }
      dVar34 = dVar39 * dVar38 + dVar36 * dVar40;
      dVar39 = dVar36 * dVar38 + -dVar40 * dVar39;
      local_80 = local_80 + 1;
      lVar4 = lVar4 + 0x100000000;
      pdVar10 = pdVar10 + 1;
      lVar21 = lVar5;
    }
    *(undefined8 *)((long)__ptr + lVar9 * 8) = 0;
    *(double *)((long)__ptr + uVar27 * 8) = dVar34;
    q[uVar27] = dVar39;
  } while( true );
  if (dVar40 < 0.0) {
    q[uVar27] = -dVar40;
    pdVar10 = local_118;
    uVar27 = uVar30;
    while (bVar32 = uVar27 != 0, uVar27 = uVar27 - 1, bVar32) {
      *pdVar10 = -*pdVar10;
      pdVar10 = pdVar10 + lVar29;
    }
  }
  local_118 = local_118 + -1;
  uVar27 = uVar25;
  goto LAB_0013a8b9;
}

Assistant:

int svd_gr(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,scale,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	//Accumulating Right Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			if (i < N - 1) {
				if (g != 0.0) {
					h = U[t+i+1] * g;
					for(j = l;j < N;++j) {
						V[j*N+i] = U[t+j] / h;
					}
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < N;++k) {
							s += U[t+k] * V[k*N+j];
						}
						for(k = l; k < N;++k) {
							V[k*N+j] += (s * V[k*N+i]);
						}
					}
				}
				for(j = l; j < N;++j) {
					V[t+j] = V[j*N+i] = 0.0;
				}
			}
		    V[t+i] = 1.0;
			g = e[i];
			l = i;
		}



	//Accumulating Left Hand Transformations

		for(i = N - 1;i >= 0;--i) {
			t = i * N;
			l = i+1;
			g = q[i];

			if (i < N - 1) {
				for(j = l;j < N;++j) {
					U[t+j] = 0.0;
				}
			}

			if (g != 0.0) {
				if (i != N - 1) {
					//h = U[t+i] * g;
					for(j = l;j < N;++j) {
						s = 0.0;
						for(k = l; k < M;++k) {
							s += (U[k*N+i] * U[k*N+j]);
						}
						f = (s / U[t+i]) / g;
						for(k = i; k < M;++k) {
							U[k*N+j] += (f * U[k*N+i]);
						}
					}
				}
				for(j = i; j < M;++j) {
					U[j*N+i] = U[j*N+i] / g;
				}
			} else {
				for(j = i; j < M;++j) {
					U[j*N+i] = 0.0;
				}
			}

			U[t+i] += 1.0;
		}
	//	mdisplay(U,M,N);

		eps = eps * x;

		for(k = N - 1; k >= 0; --k) {
			iter = 0;

			while(1) {
				iter++;
				if (iter > SVDMAXITER) {
					printf("Convergence Not Achieved \n");
					return 15;
				}

				cancel = 1;
				for(l = k; l >= 0; --l) {
					if (fabs(e[l]) <= eps) {
						cancel = 0; //test f convergence
						break;
					}
					if (fabs(q[l-1]) <= eps) {
						//Cancel
						break;
					}
				}
				if (cancel) {
					c = 0.0;
					s = 1.0;
					l1 = l - 1;
					for(i = l; i <= k;++i) {
						f = s*e[i];
						e[i] *= c;
						if (fabs(f) <= eps) {
							break;
						}
						g = q[i];
						h = q[i] = hypot(f,g);
						c = g/h;
						s = -f/h;
						for(j = 0; j < M;++j) {
							t = j * N;
							y = U[t+l1];
							z = U[t+i];

							U[t+l1] = y * c + z * s;
							U[t+i] = z * c - y * s;
						}
					}
				}
				z = q[k];
				if (l != k) {
					x = q[l];
					y = q[k-1];
					g = e[k-1];
					h = e[k];
					f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
					g = hypot(f,1.0);
					if (f < 0.0) {
						temp = f - g;
					} else {
						temp = f+g;
					}
					f = x - (z / x) * z + (h / x) * (y / temp - h);

					//Next QR Transformation

					c = s = 1.0;
					for(i = l+1; i <= k;++i) {
						g = e[i];
						y = q[i];
						h = s * g;
						g = c * g;
						e[i-1] = z = hypot(f,h);
	                    c = f / z;
	                    s = h / z;
	                    f = x * c + g * s;
	                    g = g * c - x * s;
	                    h = y * s;
	                    y *= c;
	                    for(j = 0; j < N;++j) {
	                    	t = j * N;
	                        x = V[t+i-1];
	                        z = V[t+i];
	                        V[t+i-1] = x * c + z * s;
	                        V[t+i] = z * c - x * s;
	                    }
	                    q[i-1] = z = hypot(f,h);
	                    if (z != 0.0) {
	                        c = f / z;
	                        s = h / z;
	                    }
	                    f = c * g + s * y;
	                    x = c * y - s * g;
	                    for(j = 0; j < M;++j) {
	                    	t = j * N;
	                        y = U[t+i-1];
	                        z = U[t+i];
	                        U[t+i-1] = y * c + z * s;
	                        U[t+i] = z * c - y * s;
	                    }
					}
	                    e[l] = 0.0;
	                    e[k] = f;
	                    q[k] = x;

				} else {
					//convergence
	                if (z < 0.0) {
	                    q[k] = -z;
	                    for (j = 0; j < N; j++) {
	                    	t = j *N;
	                        V[t+k] = -V[t+k];
	                    }
	                }
	                break;
				}
			}
		}

		svd_sort(U,M,N,V,q);

		free(e);
		return ierr;
}